

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O0

void initVM(VM *vm)

{
  ObjMap *pOVar1;
  VM *vm_local;
  
  vm->allocatedBytes = 0;
  vm->allObjects = (ObjHeader *)0x0;
  vm->curParser = (Parser *)0x0;
  StringBufferInit(&vm->allMethodNames);
  pOVar1 = newObjMap(vm);
  vm->allModules = pOVar1;
  vm->curParser = (Parser *)0x0;
  return;
}

Assistant:

void initVM(VM *vm) {
    vm->allocatedBytes = 0;
    vm->allObjects = NULL;
    vm->curParser = NULL;
    StringBufferInit(&vm->allMethodNames);
    vm->allModules = newObjMap(vm);
    vm->curParser = NULL;
}